

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O3

err_t MetaUnSet(node *p,dataid Id,void *Data,size_t Size)

{
  char cVar1;
  ulong *puVar2;
  char *pcVar3;
  void *Node;
  bool bVar4;
  fourcc_t PartOfClass;
  ulong *puVar5;
  err_t eVar6;
  size_t sVar7;
  bool_t bVar8;
  nodedata *pnVar9;
  char *pcVar10;
  array *p_00;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  nodedata *b;
  uint uVar15;
  dataflags Type;
  uint *puVar16;
  uint *puVar17;
  bool_t v;
  ulong local_38;
  
  puVar2 = *(ulong **)((long)p->VMT + -0x18);
  if (puVar2 == (ulong *)0x0) {
    return -4;
  }
  uVar14 = *puVar2;
  if ((long)uVar14 < 0) {
    return -4;
  }
  lVar13 = 0;
  uVar12 = uVar14;
  do {
    uVar11 = uVar14 >> 1;
    if (Id < puVar2[uVar11 * 2 + 1]) {
      uVar12 = uVar11 - 1;
    }
    else {
      if (Id <= puVar2[uVar11 * 2 + 1]) {
        puVar17 = (uint *)puVar2[uVar11 * 2 + 2];
        cVar1 = (char)*puVar17;
        if (cVar1 == '&') goto LAB_00129fe7;
        if (cVar1 == '*') {
          eVar6 = (**(code **)(puVar17 + 2))(p,Id,Data,Size);
          return eVar6;
        }
        uVar12 = uVar11;
        puVar16 = puVar17;
        if (cVar1 != '-') break;
        if (uVar14 < 2) goto LAB_00129f24;
        puVar5 = puVar2 + ((uVar14 & 0xfffffffffffffffe) - 1);
        goto LAB_00129f0b;
      }
      lVar13 = uVar11 + 1;
    }
    uVar14 = lVar13 + uVar12;
    if ((long)uVar12 < lVar13) {
      return -4;
    }
  } while( true );
LAB_00129fb5:
  uVar15 = *puVar16;
  if ((uVar15 & 0xc0) != 0x40) {
    __assert_fail("(m->Meta & META_MODE_MASK)==META_MODE_DATA",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                  ,0x952,"err_t MetaUnSet(node *, dataid, const void *, size_t)");
  }
  if ((char)puVar16[4] != '\x02') {
    Type = (dataflags)(uVar15 & 0x7f);
    lVar13 = *(long *)(puVar16 + 2);
    uVar14 = 0;
LAB_0012a012:
    puVar17 = puVar16;
    if (lVar13 < 0) {
      sVar7 = Node_DataSize(p,Id,Type,Data,0x2a);
      uVar12 = (ulong)((uint)Type & 0x3f);
      if ((uVar12 != 4) && (Size < sVar7)) {
        return -3;
      }
      if ((uVar14 & 2) == 0) goto LAB_0012a1ca;
      pnVar9 = (nodedata *)&p->Data;
      b = (nodedata *)0x0;
      goto LAB_0012a183;
    }
    sVar7 = Node_MaxDataSize(p,Id,Type,0x2a);
    uVar15 = (uint)Type & 0x3f;
    uVar11 = (ulong)uVar15;
    if (sVar7 != Size && (Data != (void *)0x0 && uVar11 != 4)) {
      __assert_fail("(Type & TYPE_MASK) == TYPE_STRING || !Data || Size == DataSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                    ,0x987,"err_t MetaUnSet(node *, dataid, const void *, size_t)");
    }
    if (((uVar15 != 4) && (Data != (void *)0x0)) && (sVar7 != Size)) {
      return -3;
    }
    p_00 = (array *)((long)&p->FourCC + lVar13);
    if ((uVar14 & 2) != 0) {
      if (uVar15 == 0x18) {
        if ((puVar2[uVar12 * 2 + 3] != Id) || (*(char *)puVar2[uVar12 * 2 + 4] != '&')) {
          __assert_fail("Lookup[Mid+1].Id == Id && Lookup[Mid+1].Meta->Meta==META_PARAM_BIT",
                        "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                        ,0x990,"err_t MetaUnSet(node *, dataid, const void *, size_t)");
        }
        local_38 = (ulong)((*(uint *)((char *)puVar2[uVar12 * 2 + 4] + 8) & *(uint *)&p_00->_Begin)
                          != 0);
        lVar13 = EqData(0x18,&local_38,Data,sVar7);
      }
      else {
        lVar13 = EqData(uVar11,p_00,Data,sVar7);
      }
      if (lVar13 != 0) {
        return 0;
      }
    }
    if ((char)puVar16[4] == '\x03') {
      puVar17 = puVar16 + 4;
      (**(code **)(puVar16 + 6))(p,Id);
    }
    if (uVar11 < 0x18) {
      if (uVar15 == 4) {
        if (p == (node *)0x0) {
          __assert_fail("(const void*)(p)!=NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                        ,0x9ad,"err_t MetaUnSet(node *, dataid, const void *, size_t)");
        }
        sVar7 = (**(code **)((long)p->VMT + 0x30))(p,Id,0x27);
        if (sVar7 == 0) {
          __assert_fail("DataSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                        ,0x9ae,"err_t MetaUnSet(node *, dataid, const void *, size_t)");
        }
        pcVar10 = "";
        if (Data != (void *)0x0) {
          pcVar10 = (char *)Data;
        }
        tcscpy_s((tchar_t *)p_00,sVar7,pcVar10);
        goto LAB_0012a42c;
      }
      if (uVar15 == 0x17) {
        if (Data == (void *)0x0) {
          pcVar10 = p_00->_Begin;
          if (pcVar10 == (char *)0x0) goto LAB_0012a42c;
          p_00->_Begin = (char *)0x0;
        }
        else {
          pcVar3 = *Data;
          pcVar10 = p_00->_Begin;
          if (pcVar10 == pcVar3) goto LAB_0012a42c;
          if (pcVar3 != (char *)0x0) {
            if (*(int *)(pcVar3 + 4) != -0xf21f594) {
              __assert_fail("((node*)Node)->Magic==NODE_MAGIC",
                            "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                            ,0x88,"void Node_ValidatePtr(anynode *)");
            }
            *(long *)(pcVar3 + 0x18) = *(long *)(pcVar3 + 0x18) + 1;
          }
          p_00->_Begin = pcVar3;
          if (pcVar10 == (char *)0x0) goto LAB_0012a42c;
        }
        Node_Release(pcVar10);
        goto LAB_0012a42c;
      }
    }
    else {
      if (uVar15 == 0x18) {
        if ((puVar2[uVar12 * 2 + 3] != Id) || (*(char *)puVar2[uVar12 * 2 + 4] != '&')) {
          __assert_fail("Lookup[Mid+1].Id == Id && Lookup[Mid+1].Meta->Meta==META_PARAM_BIT",
                        "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                        ,0x9b5,"err_t MetaUnSet(node *, dataid, const void *, size_t)");
        }
        uVar15 = *(uint *)((char *)puVar2[uVar12 * 2 + 4] + 8);
        if ((Data == (void *)0x0) || (*Data == 0)) {
          *(uint *)&p_00->_Begin = *(uint *)&p_00->_Begin & ~uVar15;
        }
        else {
          *(uint *)&p_00->_Begin = *(uint *)&p_00->_Begin | uVar15;
        }
        goto LAB_0012a42c;
      }
      if (uVar15 == 0x1e) {
        ArrayCopy(p_00,(array *)Data);
        goto LAB_0012a42c;
      }
    }
    if (Data == (void *)0x0) {
      memset(p_00,0,sVar7);
    }
    else {
      memcpy(p_00,Data,sVar7);
    }
    goto LAB_0012a42c;
  }
  uVar14 = *(ulong *)(puVar16 + 6);
  if ((uVar14 & 1) == 0) {
    Type = (dataflags)(uVar15 & 0x7f);
    lVar13 = *(long *)(puVar16 + 2);
    puVar16 = puVar16 + 4;
    if ((uVar14 & 8) != 0) {
      if ((uVar15 & 0x3f) == 10) {
        if (Size == 8 && Data != (void *)0x0) {
LAB_0012a2ae:
          Node = *Data;
          if (Node != (void *)0x0) {
            if (p == (node *)0x0) {
              __assert_fail("(const void*)(p)!=NULL",
                            "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                            ,0x96b,"err_t MetaUnSet(node *, dataid, const void *, size_t)");
            }
            PartOfClass = (**(code **)((long)p->VMT + 0x30))(p,Id,0x22);
            bVar8 = Node_IsPartOf(Node,PartOfClass);
            if (bVar8 == 0) {
              return -3;
            }
          }
        }
      }
      else if (((Size == 8) && (Data != (void *)0x0)) && ((uVar15 & 0x3f) == 0x17))
      goto LAB_0012a2ae;
    }
    goto LAB_0012a012;
  }
  uVar12 = uVar11;
  puVar16 = puVar17;
  if (cVar1 == '&') {
LAB_00129fe7:
    puVar16 = (uint *)puVar2[(uVar11 - 1) * 2 + 2];
    uVar12 = uVar11 - 1;
  }
  goto LAB_00129fb5;
  while (pnVar9->Code != (Id << 8 | uVar12)) {
LAB_0012a183:
    pnVar9 = pnVar9->Next;
    if (pnVar9 == (nodedata *)0x0) goto LAB_0012a198;
  }
  b = pnVar9 + 1;
LAB_0012a198:
  sVar7 = Node_MaxDataSize(p,Id,Type,0x28);
  bVar8 = EqData(uVar12,Data,b,sVar7);
  if (bVar8 != 0) {
    return 0;
  }
LAB_0012a1ca:
  if ((char)puVar16[4] == '\x03') {
    __assert_fail("m[1].Meta != META_PARAM_DATA_RELEASE",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                  ,0x97c,"err_t MetaUnSet(node *, dataid, const void *, size_t)");
  }
  if (p == (node *)0x0) {
    __assert_fail("(const void*)(p)!=NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                  ,0x97f,"err_t MetaUnSet(node *, dataid, const void *, size_t)");
  }
  (**(code **)((long)p->VMT + 0x40))(p,Id,uVar12,Data);
LAB_0012a42c:
  if ((char)puVar17[4] == '\x04') {
    eVar6 = (**(code **)(puVar17 + 6))(p,Id);
  }
  else {
    eVar6 = 0;
  }
  if ((uVar14 & 4) != 0) {
    Node_Notify(p,Id);
    return eVar6;
  }
  return eVar6;
  while( true ) {
    puVar5 = puVar5 + -2;
    bVar4 = (long)uVar11 < 2;
    uVar11 = uVar11 - 1;
    if (bVar4) break;
LAB_00129f0b:
    if (*puVar5 != Id) goto LAB_00129f24;
  }
  uVar11 = 0;
LAB_00129f24:
  lVar13 = uVar11 - 1;
  puVar5 = puVar2 + uVar11 * 2 + 3;
  do {
    if (*(char *)puVar5[-1] != '-') {
      __assert_fail("Lookup[Mid].Meta->Meta==META_PARAM_EVENT",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                    ,0x944,"err_t MetaUnSet(node *, dataid, const void *, size_t)");
    }
    eVar6 = (**(code **)((char *)puVar5[-1] + 8))(p,Id);
  } while (((eVar6 == 0) && (lVar13 = lVar13 + 1, eVar6 = 0, lVar13 < (long)*puVar2)) &&
          (uVar14 = *puVar5, puVar5 = puVar5 + 2, uVar14 == Id));
  return eVar6;
}

Assistant:

static INLINE nodeclass* NodeGetClass(const node* p)
{
    return ((nodeclass*)p->VMT)-1;
}